

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

void __thiscall helics::apps::Clone::generateInterfaces(Clone *this)

{
  string_view sourceEndpoint;
  string_view key;
  string_view fedName;
  string_view target;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  iterator iVar4;
  iterator iVar5;
  iterator this_00;
  Clone *in_RDI;
  __sv_type queryres;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ept;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pub;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pubs;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffcfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  _func_int *p_Var7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffd10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  const_iterator __last;
  const_iterator __first_00;
  Clone *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *pcVar8;
  Federate *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Federate *in_stack_fffffffffffffde8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  HelicsSequencingModes mode;
  string_view in_stack_fffffffffffffe20;
  undefined1 local_1a0 [40];
  reference local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  undefined1 *local_160;
  Federate *in_stack_fffffffffffffeb8;
  undefined1 local_108 [24];
  __sv_type local_f0;
  reference local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  undefined1 *local_c8;
  __sv_type local_a0;
  char local_90 [32];
  __sv_type local_70;
  undefined1 local_60 [96];
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x42009a);
  Federate::enterInitializingModeIterative(in_stack_fffffffffffffeb8);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4200b6);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_fffffffffffffd10._M_current,(char *)in_stack_fffffffffffffd08);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_fffffffffffffd10._M_current,(char *)in_stack_fffffffffffffd08);
  target._M_str = in_stack_fffffffffffffe08;
  target._M_len = in_stack_fffffffffffffe00;
  Federate::query_abi_cxx11_
            (in_stack_fffffffffffffde8,target,(string_view)in_stack_fffffffffffffdf0,
             (HelicsSequencingModes)in_stack_fffffffffffffe20._M_len);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x420141);
  p_Var7 = (_func_int *)
           ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_fffffffffffffd10._M_current,(char *)in_stack_fffffffffffffd08);
  uVar6 = 1;
  pcVar8 = local_90;
  target_00._M_str = in_stack_fffffffffffffe08;
  target_00._M_len = in_stack_fffffffffffffe00;
  Federate::query_abi_cxx11_
            (in_stack_fffffffffffffde8,target_00,(string_view)in_stack_fffffffffffffdf0,
             (HelicsSequencingModes)in_stack_fffffffffffffe20._M_len);
  local_70 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  vectorizeQueryResult_abi_cxx11_(in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  local_c8 = local_60;
  local_d0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd00,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcfc,uVar6)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_e0 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_d0);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x420293
                      );
    if (!bVar1) {
      local_f0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00)
      ;
      key._M_str = pcVar8;
      key._M_len = (size_t)p_Var7;
      addSubscription(in_RDI,key);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_d0);
  }
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x420335);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
            (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_fffffffffffffd10._M_current,(char *)in_stack_fffffffffffffd08);
  uVar6 = 1;
  target_01._M_str = in_stack_fffffffffffffe08;
  target_01._M_len = in_stack_fffffffffffffe00;
  Federate::query_abi_cxx11_
            (in_stack_fffffffffffffde8,target_01,(string_view)in_stack_fffffffffffffdf0,
             (HelicsSequencingModes)in_stack_fffffffffffffe20._M_len);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  vectorizeQueryResult_abi_cxx11_(in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  local_160 = local_108;
  local_168._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd00,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcfc,uVar6)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_178 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_168);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x42047b
                      );
    if (!bVar1) {
      local_1a0._24_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
      sourceEndpoint._M_str = (char *)this_01;
      sourceEndpoint._M_len = in_stack_fffffffffffffd48;
      addSourceEndpointClone(in_stack_fffffffffffffd40,sourceEndpoint);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_168);
  }
  peVar3 = CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(in_RDI->super_App).fed.
                       super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (peVar3 != (element_type *)0x0) {
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
            (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
  }
  queryres = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  fedName._M_str = in_stack_fffffffffffffda8;
  fedName._M_len = in_stack_fffffffffffffda0;
  queryFederateSubscriptions_abi_cxx11_(in_stack_fffffffffffffd98,fedName);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  vectorizeQueryResult_abi_cxx11_(queryres);
  mode = (HelicsSequencingModes)queryres._M_len;
  __last._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &in_RDI->cloneSubscriptionNames;
  __first._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd10._M_current,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd10._M_current);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  iVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  __first_00._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xfffffffffffffde0
  ;
  std::__cxx11::string::string(in_stack_fffffffffffffd10._M_current);
  std::
  remove<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
            (__first,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffd00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffd00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffcfc,uVar6));
  this_00 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase(__first._M_current,__first_00,__last);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4206f8);
  p_Var7 = (_func_int *)
           ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00._M_current,(char *)p_Var7);
  target_02._M_str = (char *)iVar4._M_current;
  target_02._M_len = (size_t)iVar5._M_current;
  Federate::query_abi_cxx11_
            (in_stack_fffffffffffffde8,target_02,(string_view)in_stack_fffffffffffffdf0,mode);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,__str);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00._M_current);
  return;
}

Assistant:

void Clone::generateInterfaces()
{
    fed->enterInitializingModeIterative();

    fed->query("root", "global_flush", HELICS_SEQUENCING_MODE_ORDERED);
    auto pubs = vectorizeQueryResult(
        fed->query(captureFederate, "publications", HELICS_SEQUENCING_MODE_ORDERED));
    for (auto& pub : pubs) {
        if (pub.empty()) {
            continue;
        }
        addSubscription(pub);
    }
    auto epts = vectorizeQueryResult(
        fed->query(captureFederate, "endpoints", HELICS_SEQUENCING_MODE_ORDERED));
    for (auto& ept : epts) {
        if (ept.empty()) {
            continue;
        }
        addSourceEndpointClone(ept);
    }
    cloneSubscriptionNames =
        vectorizeQueryResult(queryFederateSubscriptions(fed.get(), captureFederate));
    // get rid of any empty strings that may have come to be
    cloneSubscriptionNames.erase(std::remove(cloneSubscriptionNames.begin(),
                                             cloneSubscriptionNames.end(),
                                             std::string{}),
                                 cloneSubscriptionNames.end());

    fedConfig = fed->query(captureFederate, "config", HELICS_SEQUENCING_MODE_ORDERED);
}